

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O0

Real __thiscall amrex::MLNodeLinOp::AnyNormInfMask(MLNodeLinOp *this,int amrlev,Any *a,bool local)

{
  int iVar1;
  int in_ESI;
  MLLinOp *in_RDI;
  Real RVar2;
  iMultiFab *fine_mask;
  int finest_level;
  MultiFab *mf;
  undefined1 in_stack_000002d7;
  iMultiFab *in_stack_000002d8;
  MultiFab *in_stack_000002e0;
  MLLinOp *in_stack_000002e8;
  size_type in_stack_ffffffffffffffb8;
  
  Any::get<amrex::MultiFab>((Any *)in_RDI);
  iVar1 = MLLinOp::NAMRLevels(in_RDI);
  if (in_ESI != iVar1 + -1) {
    Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                  *)in_RDI,in_stack_ffffffffffffffb8);
    std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::get
              ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)in_RDI);
  }
  RVar2 = MLLinOp::MFNormInf(in_stack_000002e8,in_stack_000002e0,in_stack_000002d8,
                             (bool)in_stack_000002d7);
  return RVar2;
}

Assistant:

Real
MLNodeLinOp::AnyNormInfMask (int amrlev, Any const& a, bool local) const
{
    AMREX_ASSERT(a.is<MultiFab>());
    auto& mf = a.get<MultiFab>();

    const int finest_level = NAMRLevels() - 1;
    iMultiFab const* fine_mask = (amrlev == finest_level)
        ? nullptr : m_norm_fine_mask[amrlev].get();
    return MFNormInf(mf, fine_mask, local);
}